

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

int FMstruct_size_field_list(FMFieldList list,int pointer_size)

{
  long *plVar1;
  char *__s;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  long elements;
  int local_30 [2];
  
  if (list->field_name == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    ppcVar6 = &list->field_type;
    iVar5 = 0;
    do {
      iVar2 = is_all_static_array_dimens(*ppcVar6);
      iVar4 = pointer_size;
      if (iVar2 != 0) {
        __s = *ppcVar6;
        pcVar3 = strchr(__s,0x2a);
        if (pcVar3 == (char *)0x0) {
          FMarray_str_to_data_type(__s,(long *)local_30);
          iVar4 = *(int *)(ppcVar6 + 1) * local_30[0];
        }
      }
      iVar4 = iVar4 + *(int *)((long)ppcVar6 + 0xc);
      if (iVar5 <= iVar4) {
        iVar5 = iVar4;
      }
      plVar1 = (long *)(ppcVar6 + 2);
      ppcVar6 = ppcVar6 + 3;
    } while (*plVar1 != 0);
  }
  return iVar5;
}

Assistant:

extern
int
FMstruct_size_field_list(FMFieldList list, int pointer_size)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if ((is_var_array_field(list, i) == 1) || (strchr(list[i].field_type, '*'))) {
	    /* variant array, real_field_size is fmformat->pointer_size */
	    field_size = pointer_size;
	} else {
	    long elements;
	    FMarray_str_to_data_type(list[i].field_type, &elements);
	    field_size = list[i].field_size * elements;
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
/*	printf("i=%d field_name=%s field_type=%s struct_size= %d, offset=%d size=%d\n", i, list[i].field_name, list[i].field_type, struct_size, list[i].field_offset, field_size);*/
	i++;
    }
    return struct_size;
}